

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void __thiscall
duckdb::Executor::AddToBeRescheduled(Executor *this,shared_ptr<duckdb::Task,_true> *task_p)

{
  iterator iVar1;
  mapped_type *this_00;
  element_type *local_20;
  
  ::std::mutex::lock(&this->executor_lock);
  if (this->cancelled == false) {
    local_20 = (task_p->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    iVar1 = ::std::
            _Hashtable<duckdb::Task_*,_std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>,_std::allocator<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Task_*>,_std::hash<duckdb::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->to_be_rescheduled_tasks)._M_h,&local_20);
    if (iVar1.
        super__Node_iterator_base<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_20 = (task_p->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      this_00 = ::std::__detail::
                _Map_base<duckdb::Task_*,_std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>,_std::allocator<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Task_*>,_std::hash<duckdb::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<duckdb::Task_*,_std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>,_std::allocator<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Task_*>,_std::hash<duckdb::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->to_be_rescheduled_tasks,&local_20);
      shared_ptr<duckdb::Task,_true>::operator=(this_00,task_p);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->executor_lock);
  return;
}

Assistant:

void Executor::AddToBeRescheduled(shared_ptr<Task> &task_p) {
	lock_guard<mutex> l(executor_lock);
	if (cancelled) {
		return;
	}
	if (to_be_rescheduled_tasks.find(task_p.get()) != to_be_rescheduled_tasks.end()) {
		return;
	}
	to_be_rescheduled_tasks[task_p.get()] = std::move(task_p);
}